

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::SamplePosQueryCase::iterate(SamplePosQueryCase *this)

{
  ostringstream *this_00;
  int iVar1;
  GLenum err;
  undefined4 extraout_var;
  RenderTarget *pRVar2;
  char *description;
  GLuint index;
  byte bVar3;
  Vec2 samplePos;
  CallLogWrapper gl;
  Vector<float,_2> local_1d0;
  CallLogWrapper local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1c8,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_1c8.m_enableLog = true;
  this_00 = (ostringstream *)(local_1b0 + 8);
  index = 0;
  bVar3 = 0;
  while( true ) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar2->m_numSamples <= (int)index) break;
    local_1d0.m_data[0] = -1.0;
    local_1d0.m_data[1] = -1.0;
    glu::CallLogWrapper::glGetMultisamplefv(&local_1c8,0x8e50,index,local_1d0.m_data);
    err = glu::CallLogWrapper::glGetError(&local_1c8);
    glu::checkError(err,"getMultisamplefv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x90);
    if ((((local_1d0.m_data[0] < 0.0) || (1.0 < local_1d0.m_data[0])) || (local_1d0.m_data[1] < 0.0)
        ) || (1.0 < local_1d0.m_data[1])) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Sample ",7);
      std::ostream::operator<<(this_00,index);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," is not in valid range [0,1], got ",0x22);
      tcu::operator<<((ostream *)this_00,&local_1d0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar3 = 1;
    }
    index = index + 1;
  }
  description = "Pass";
  if (bVar3 != 0) {
    description = "Invalid sample pos";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar3,description)
  ;
  glu::CallLogWrapper::~CallLogWrapper(&local_1c8);
  return STOP;
}

Assistant:

SamplePosQueryCase::IterateResult SamplePosQueryCase::iterate (void)
{
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	bool				error	= false;

	gl.enableLogging(true);

	for (int ndx = 0; ndx < m_context.getRenderTarget().getNumSamples(); ++ndx)
	{
		tcu::Vec2 samplePos = tcu::Vec2(-1, -1);

		gl.glGetMultisamplefv(GL_SAMPLE_POSITION, ndx, samplePos.getPtr());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getMultisamplefv");

		// check value range
		if (samplePos.x() < 0.0f || samplePos.x() > 1.0f ||
			samplePos.y() < 0.0f || samplePos.y() > 1.0f)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Sample " << ndx << " is not in valid range [0,1], got " << samplePos << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid sample pos");

	return STOP;
}